

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_utils.hpp
# Opt level: O2

uint time_utils::slurp_digits(char **s,char until)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  undefined8 *puVar4;
  
  uVar3 = 0;
  pcVar2 = *s;
  while( true ) {
    cVar1 = *pcVar2;
    *s = pcVar2 + 1;
    if (cVar1 == until) {
      return uVar3;
    }
    if ((byte)(cVar1 - 0x3aU) < 0xf6) break;
    uVar3 = (uVar3 * 10 + (int)cVar1) - 0x30;
    pcVar2 = pcVar2 + 1;
  }
  fprintf(_stderr,"Symbol: %c (until \'%c\')\n",(ulong)(uint)(int)cVar1,(ulong)(byte)until);
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &PTR__exception_00106d78;
  __cxa_throw(puVar4,&InvalidDateTime::typeinfo,std::exception::~exception);
}

Assistant:

static inline
unsigned slurp_digits(const char *&s, char until)
{
    unsigned r = 0;
    while (true) {
        const char c = *s;
        ++s;
        if (c == until)
            break;
        const int digit = static_cast<int>(c) - '0';
        if (digit < 0 || digit > 9) {
            fprintf(stderr, "Symbol: %c (until '%c')\n", c, until);
            throw InvalidDateTime{};
        }
        r = r * 10 + digit;
    }
    return r;
}